

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_cl_kernels.cxx
# Opt level: O0

bool __thiscall
OpenCLKernels::runKernelUpdateFlickerCounter
          (OpenCLKernels *this,UMat *adjacent_frames_similarity_sum,uint similarity_max,
          UMat *corresponding_frames_similarity_sum,float threshold,UMat *flicker_counter,
          string *error)

{
  bool bVar1;
  byte bVar2;
  Kernel *pKVar3;
  Queue local_108 [8];
  KernelArg local_100 [40];
  KernelArg local_d8 [56];
  KernelArg local_a0 [40];
  scoped_lock<std::mutex> local_78;
  scoped_lock<std::mutex> lock;
  undefined8 uStack_68;
  bool execution_result;
  size_t local_size [2];
  size_t global_size [2];
  string *error_local;
  UMat *flicker_counter_local;
  UMat *pUStack_30;
  float threshold_local;
  UMat *corresponding_frames_similarity_sum_local;
  UMat *pUStack_20;
  uint similarity_max_local;
  UMat *adjacent_frames_similarity_sum_local;
  OpenCLKernels *this_local;
  
  flicker_counter_local._4_4_ = threshold;
  pUStack_30 = corresponding_frames_similarity_sum;
  corresponding_frames_similarity_sum_local._4_4_ = similarity_max;
  pUStack_20 = adjacent_frames_similarity_sum;
  adjacent_frames_similarity_sum_local = (UMat *)this;
  bVar1 = isAvailable(this,error);
  if (bVar1) {
    local_size[1] = (size_t)*(int *)(pUStack_20 + 0xc);
    uStack_68 = 0x10;
    local_size[0] = 0x10;
    std::scoped_lock<std::mutex>::scoped_lock(&local_78,&this->kernel_update_flicker_counter_guard);
    cv::ocl::KernelArg::ReadOnlyNoSize(local_a0,pUStack_20,1,1);
    cv::ocl::KernelArg::ReadOnlyNoSize(local_d8,pUStack_30,1,1);
    cv::ocl::KernelArg::ReadWriteNoSize(local_100,flicker_counter,1,1);
    pKVar3 = cv::ocl::Kernel::
             args<cv::ocl::KernelArg,unsigned_int,cv::ocl::KernelArg,float,cv::ocl::KernelArg>
                       (&this->kernel_update_flicker_counter,local_a0,
                        (uint *)((long)&corresponding_frames_similarity_sum_local + 4),local_d8,
                        (float *)((long)&flicker_counter_local + 4),local_100);
    cv::ocl::Queue::Queue(local_108);
    bVar2 = cv::ocl::Kernel::run
                      ((int)pKVar3,(ulong *)0x2,local_size + 1,SUB81(&stack0xffffffffffffff98,0),
                       (Queue *)0x1);
    lock._M_device._7_1_ = bVar2 & 1;
    cv::ocl::Queue::~Queue(local_108);
    std::scoped_lock<std::mutex>::~scoped_lock(&local_78);
    if ((lock._M_device._7_1_ & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)error,"OpenCL kernel: kernel_update_flicker_counter launch failed.");
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool OpenCLKernels::runKernelUpdateFlickerCounter(const UMat &adjacent_frames_similarity_sum,
                                                  unsigned int similarity_max,
                                                  const UMat &corresponding_frames_similarity_sum, float threshold,
                                                  UMat &flicker_counter, std::string &error)
{
    if(!isAvailable(error)) {
        return false;
    }

    size_t global_size[2] = {(size_t) adjacent_frames_similarity_sum.cols,
                             (size_t) adjacent_frames_similarity_sum.rows};
    size_t local_size[2] = {16, 16};
    bool execution_result;
    {
        scoped_lock<mutex> lock(kernel_update_flicker_counter_guard);
        execution_result = kernel_update_flicker_counter.args(
                        cv::ocl::KernelArg::ReadOnlyNoSize(adjacent_frames_similarity_sum),
                        similarity_max,
                        cv::ocl::KernelArg::ReadOnlyNoSize(corresponding_frames_similarity_sum),
                        threshold,
                        cv::ocl::KernelArg::ReadWriteNoSize(flicker_counter)
                ).run(2, global_size, local_size, true);
    }
    if(!execution_result) {
        error = "OpenCL kernel: kernel_update_flicker_counter launch failed.";
        return false;
    }

    return true;
}